

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeSets
          (ShaderResourceCacheVk *this,IMemoryAllocator *MemAllocator,Uint32 NumSets,
          Uint32 *SetSizes)

{
  Uint32 UVar1;
  int iVar2;
  size_t sVar3;
  undefined4 extraout_var;
  DescriptorSet *pDVar4;
  char (*Args_1) [55];
  char *Args_1_00;
  Resource *pRVar5;
  long lVar6;
  char (*in_R8) [37];
  uint uVar7;
  size_t sVar8;
  Uint32 t;
  ulong uVar9;
  Resource *pRVar10;
  Uint32 t_1;
  Uint32 NumSets_local;
  string msg;
  
  Args_1 = (char (*) [55])SetSizes;
  NumSets_local = NumSets;
  if ((this->m_pMemory)._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl != (void *)0x0) {
    FormatString<char[34]>(&msg,(char (*) [34])"Memory has already been allocated");
    Args_1 = (char (*) [55])0x37;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x37);
    std::__cxx11::string::~string((string *)&msg);
  }
  this->m_NumSets = (Uint16)NumSets;
  if (0xffff < NumSets) {
    FormatString<char[10],unsigned_int,char[37]>
              (&msg,(Diligent *)"NumSets (",(char (*) [10])&NumSets_local,
               (uint *)") exceed maximum representable value",in_R8);
    Args_1 = (char (*) [55])0x44;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar7 = *(uint *)&this->field_0x1c & 0x80000000;
  *(uint *)&this->field_0x1c = uVar7;
  uVar9 = 0;
  while( true ) {
    if (NumSets_local <= uVar9) break;
    UVar1 = SetSizes[uVar9];
    if (UVar1 == 0) {
      FormatString<char[26],char[16]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"SetSizes[t] > 0",
                 (char (*) [16])Args_1);
      Args_1 = (char (*) [55])0x49;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x49);
      std::__cxx11::string::~string((string *)&msg);
      UVar1 = SetSizes[uVar9];
      uVar7 = *(uint *)&this->field_0x1c;
    }
    uVar7 = uVar7 & 0x80000000 | UVar1 + uVar7 & 0x7fffffff;
    *(uint *)&this->field_0x1c = uVar7;
    uVar9 = uVar9 + 1;
  }
  sVar8 = (ulong)(uVar7 & 0x7fffffff) * 0x20 + (ulong)NumSets_local * 0x30;
  sVar3 = GetRequiredMemorySize(NumSets_local,SetSizes);
  if (sVar8 != sVar3) {
    FormatString<char[26],char[55]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemorySize == GetRequiredMemorySize(NumSets, SetSizes)",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x4e);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::resize(&this->m_DbgInitializedResources,(ulong)this->m_NumSets);
  if (sVar8 != 0) {
    Args_1_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
    ;
    iVar2 = (**MemAllocator->_vptr_IMemoryAllocator)
                      (MemAllocator,sVar8,"Memory for shader resource cache data",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                       ,0x55);
    msg._M_string_length = CONCAT44(extraout_var,iVar2);
    msg._M_dataplus._M_p = (pointer)MemAllocator;
    std::__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
              ((__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               &this->m_pMemory,
               (__uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               &msg);
    std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
              ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)&msg);
    pRVar10 = (Resource *)
              ((ulong)this->m_NumSets * 0x30 +
              (long)(this->m_pMemory)._M_t.
                    super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                    .super__Head_base<0UL,_void_*,_false>._M_head_impl);
    lVar6 = 0;
    for (uVar9 = 0; uVar9 < NumSets_local; uVar9 = uVar9 + 1) {
      pDVar4 = GetDescriptorSet(this,(Uint32)uVar9);
      uVar7 = SetSizes[uVar9];
      Args_1_00 = (char *)(ulong)uVar7;
      pRVar5 = pRVar10;
      if (uVar7 == 0) {
        pRVar5 = (Resource *)0x0;
      }
      pDVar4->m_NumResources = uVar7;
      pDVar4->m_pResources = pRVar5;
      (pDVar4->m_DescriptorSetAllocation).CmdQueueMask = 0;
      (pDVar4->m_DescriptorSetAllocation).DescrSetAllocator = (DescriptorSetAllocator *)0x0;
      (pDVar4->m_DescriptorSetAllocation).Set = (VkDescriptorSet)0x0;
      (pDVar4->m_DescriptorSetAllocation).Pool = (VkDescriptorPool)0x0;
      pRVar10 = pRVar10 + SetSizes[uVar9];
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->m_DbgInitializedResources).
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6),
                 (ulong)SetSizes[uVar9],false);
      lVar6 = lVar6 + 0x28;
    }
    if (pRVar10 !=
        (Resource *)
        (sVar8 + (long)(this->m_pMemory)._M_t.
                       super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                       .super__Head_base<0UL,_void_*,_false>._M_head_impl)) {
      FormatString<char[26],char[58]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize",
                 (char (*) [58])Args_1_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,99);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeSets(IMemoryAllocator& MemAllocator, Uint32 NumSets, const Uint32* SetSizes)
{
    VERIFY(!m_pMemory, "Memory has already been allocated");

    // Memory layout:
    //
    //  m_pMemory
    //  |
    //  V
    // ||  DescriptorSet[0]  |   ....    |  DescriptorSet[Ns-1]  |  Res[0]  |  ... |  Res[n-1]  |    ....     | Res[0]  |  ... |  Res[m-1]  ||
    //
    //
    //  Ns = m_NumSets

    m_NumSets = static_cast<Uint16>(NumSets);
    VERIFY(m_NumSets == NumSets, "NumSets (", NumSets, ") exceed maximum representable value");

    m_TotalResources = 0;
    for (Uint32 t = 0; t < NumSets; ++t)
    {
        VERIFY_EXPR(SetSizes[t] > 0);
        m_TotalResources += SetSizes[t];
    }

    const size_t MemorySize = NumSets * sizeof(DescriptorSet) + m_TotalResources * sizeof(Resource);
    VERIFY_EXPR(MemorySize == GetRequiredMemorySize(NumSets, SetSizes));
#ifdef DILIGENT_DEBUG
    m_DbgInitializedResources.resize(m_NumSets);
#endif
    if (MemorySize > 0)
    {
        m_pMemory = decltype(m_pMemory){
            ALLOCATE_RAW(MemAllocator, "Memory for shader resource cache data", MemorySize),
            STDDeleter<void, IMemoryAllocator>(MemAllocator) //
        };

        DescriptorSet* pSets       = reinterpret_cast<DescriptorSet*>(m_pMemory.get());
        Resource*      pCurrResPtr = reinterpret_cast<Resource*>(pSets + m_NumSets);
        for (Uint32 t = 0; t < NumSets; ++t)
        {
            new (&GetDescriptorSet(t)) DescriptorSet{SetSizes[t], SetSizes[t] > 0 ? pCurrResPtr : nullptr};
            pCurrResPtr += SetSizes[t];
#ifdef DILIGENT_DEBUG
            m_DbgInitializedResources[t].resize(SetSizes[t]);
#endif
        }
        VERIFY_EXPR((char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize);
    }
}